

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O3

int64_t parse_assignment(void)

{
  int32_t iVar1;
  uint uVar2;
  int iVar3;
  int64_t extraout_RAX;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined1 *puVar6;
  int64_t extraout_RAX_00;
  int64_t *piVar7;
  ulong unaff_RBX;
  char *pcVar8;
  long lVar9;
  size_t sVar10;
  int32_t local_2c;
  
  local_2c = next_char();
  if (local_2c < 0x2e) {
    if (local_2c != 10) {
      if (local_2c == 0x23) goto LAB_00111efd;
      if (local_2c == -1) {
        pcVar8 = "unexpected end-of-file (without \'.\')";
        goto LAB_00112381;
      }
      goto LAB_00111f24;
    }
    columno = last_line_length;
    piVar7 = &lineno;
  }
  else {
    if (local_2c == 0x40) {
LAB_00111efd:
      charno = charno + -1;
      columno = columno + -1;
      char_saved = 1;
      saved_char = local_2c;
      return -1;
    }
    if (local_2c == 0x2e) {
      do {
        uVar2 = next_char();
      } while (uVar2 == 0x20);
      unaff_RBX = (ulong)uVar2;
      if (uVar2 == 10) {
        msg(4,"read terminating \'.\'");
        found_end_of_witness = 1;
        return -1;
      }
      if (uVar2 != 0xffffffff) {
        iVar3 = isprint(uVar2);
        if (iVar3 != 0) goto LAB_00112388;
        pcVar8 = "unexpected character code 0x%02x after \'.\'";
        goto LAB_0011238f;
      }
      pcVar8 = "end-of-file after \'.\' instead of new-line";
      goto LAB_00112381;
    }
LAB_00111f24:
    charno = charno + -1;
    piVar7 = &columno;
  }
  *piVar7 = *piVar7 + -1;
  char_saved = 1;
  saved_char = local_2c;
  unaff_RBX = parse_unsigned_number(&local_2c);
  if (local_2c != 0x20) goto LAB_001123a7;
  iVar1 = next_char();
  _ZL11array_index_1 = _ZL11array_index_0;
  if (iVar1 == -1) {
LAB_00112143:
    char_saved = 1;
    saved_char = iVar1;
LAB_00112150:
    _ZL8constant_1 = _ZL8constant_0;
    constant_columno = columno + 1;
    uVar2 = next_char();
    while ((uVar2 & 0xfffffffe) == 0x30) {
      if (_ZL8constant_1 == _ZL8constant_2) {
        sVar10 = ((long)_ZL8constant_1 - (long)_ZL8constant_0) * 2;
        lVar9 = (long)_ZL8constant_1 - (long)_ZL8constant_0;
        if (lVar9 == 0) {
          sVar10 = 1;
        }
        puVar6 = (undefined1 *)realloc(_ZL8constant_0,sVar10);
        if (puVar6 == (undefined1 *)0x0) goto LAB_00112398;
        _ZL8constant_1 = puVar6 + lVar9;
        _ZL8constant_2 = puVar6 + sVar10;
        _ZL8constant_0 = puVar6;
      }
      puVar6 = _ZL8constant_1 + 1;
      *_ZL8constant_1 = (char)uVar2;
      _ZL8constant_1 = puVar6;
      uVar2 = next_char();
    }
    lVar9 = (long)_ZL8constant_1 - (long)_ZL8constant_0;
    if (lVar9 == 0) goto LAB_001123b8;
    if ((uVar2 != 10) && (uVar2 != 0x20)) {
      pcVar8 = "expected space or new-line after assignment";
      goto LAB_00112381;
    }
    if (_ZL8constant_1 == _ZL8constant_2) {
      puVar6 = (undefined1 *)realloc(_ZL8constant_0,lVar9 * 2);
      if (puVar6 == (undefined1 *)0x0) {
        parse_assignment();
LAB_001123cf:
        pcVar8 = "expected ] after index";
        goto LAB_00112381;
      }
      _ZL8constant_1 = puVar6 + lVar9;
      _ZL8constant_2 = puVar6 + lVar9 * 2;
      _ZL8constant_0 = puVar6;
    }
    puVar6 = _ZL8constant_1 + 1;
    *_ZL8constant_1 = 0;
    _ZL8constant_1 = puVar6;
    _ZL6symbol_1 = _ZL6symbol_0;
    if (uVar2 == 10) {
      _ZL6symbol_1 = _ZL6symbol_0;
      return unaff_RBX;
    }
    do {
      iVar1 = next_char();
      puVar4 = _ZL6symbol_1;
      if (iVar1 == 10) break;
      if (iVar1 == -1) {
        pcVar8 = "unexpected end-of-file in assignment";
        goto LAB_00112381;
      }
      if (_ZL6symbol_1 == _ZL6symbol_2) {
        sVar10 = ((long)_ZL6symbol_1 - (long)_ZL6symbol_0) * 2;
        lVar9 = (long)_ZL6symbol_1 - (long)_ZL6symbol_0;
        if (lVar9 == 0) {
          sVar10 = 1;
        }
        puVar4 = (undefined8 *)realloc(_ZL6symbol_0,sVar10);
        if (puVar4 == (undefined8 *)0x0) {
          do {
            parse_assignment();
LAB_001123a2:
            parse_assignment();
LAB_001123a7:
            parse_error("space missing after \'%ld\'",unaff_RBX);
LAB_001123b8:
            pcVar8 = "empty constant";
LAB_00112381:
            parse_error(pcVar8);
LAB_00112388:
            pcVar8 = "unexpected character \'%c\' after \'.\'";
LAB_0011238f:
            parse_error(pcVar8,unaff_RBX & 0xffffffff);
LAB_00112398:
            parse_assignment();
          } while( true );
        }
        _ZL6symbol_1 = (undefined8 *)(lVar9 + (long)puVar4);
        _ZL6symbol_2 = (undefined8 *)(sVar10 + (long)puVar4);
        _ZL6symbol_0 = puVar4;
      }
      puVar4 = (undefined8 *)((long)_ZL6symbol_1 + 1);
      puVar5 = puVar4;
      *(char *)_ZL6symbol_1 = (char)iVar1;
      _ZL6symbol_1 = puVar5;
    } while (iVar1 != 10);
    lVar9 = (long)puVar4 - (long)_ZL6symbol_0;
    if (lVar9 == 0) {
      return unaff_RBX;
    }
    if (puVar4 != _ZL6symbol_2) {
LAB_0011233a:
      _ZL6symbol_1 = (undefined8 *)((long)puVar4 + 1);
      *(undefined1 *)puVar4 = 0;
      return unaff_RBX;
    }
    puVar4 = _ZL6symbol_0;
    puVar5 = (undefined8 *)realloc(_ZL6symbol_0,lVar9 * 2);
    if (puVar5 != (undefined8 *)0x0) {
      puVar4 = (undefined8 *)(lVar9 + (long)puVar5);
      _ZL6symbol_2 = (undefined8 *)(lVar9 * 2 + (long)puVar5);
      _ZL6symbol_0 = puVar5;
      goto LAB_0011233a;
    }
    parse_assignment();
  }
  else {
    if (iVar1 == 10) {
      columno = last_line_length;
      piVar7 = &lineno;
LAB_00112140:
      *piVar7 = *piVar7 + -1;
      goto LAB_00112143;
    }
    if (iVar1 != 0x5b) {
      charno = charno + -1;
      piVar7 = &columno;
      goto LAB_00112140;
    }
    index_columno = columno + 1;
    uVar2 = next_char();
    puVar4 = _ZL11array_index_0;
    while (_ZL11array_index_0 = puVar4, (uVar2 & 0xfffffffe) == 0x30) {
      if (_ZL11array_index_1 == _ZL11array_index_2) {
        sVar10 = ((long)_ZL11array_index_1 - (long)puVar4) * 2;
        lVar9 = (long)_ZL11array_index_1 - (long)puVar4;
        if (lVar9 == 0) {
          sVar10 = 1;
        }
        puVar4 = (undefined8 *)realloc(puVar4,sVar10);
        if (puVar4 == (undefined8 *)0x0) goto LAB_001123a2;
        _ZL11array_index_1 = (undefined8 *)(lVar9 + (long)puVar4);
        _ZL11array_index_2 = (undefined8 *)(sVar10 + (long)puVar4);
        _ZL11array_index_0 = puVar4;
      }
      puVar4 = (undefined8 *)((long)_ZL11array_index_1 + 1);
      *(char *)_ZL11array_index_1 = (char)uVar2;
      _ZL11array_index_1 = puVar4;
      uVar2 = next_char();
      puVar4 = _ZL11array_index_0;
    }
    if (uVar2 == 0x2a) {
      if (_ZL11array_index_1 == _ZL11array_index_2) {
        lVar9 = (long)_ZL11array_index_1 - (long)puVar4;
        sVar10 = 1;
        if (lVar9 != 0) {
          sVar10 = ((long)_ZL11array_index_1 - (long)puVar4) * 2;
        }
        puVar5 = (undefined8 *)realloc(puVar4,sVar10);
        if (puVar5 == (undefined8 *)0x0) goto LAB_001123eb;
        _ZL11array_index_1 = (undefined8 *)(lVar9 + (long)puVar5);
        _ZL11array_index_2 = (undefined8 *)(sVar10 + (long)puVar5);
        _ZL11array_index_0 = puVar5;
      }
      puVar4 = (undefined8 *)((long)_ZL11array_index_1 + 1);
      *(undefined1 *)_ZL11array_index_1 = 0x2a;
      _ZL11array_index_1 = puVar4;
      uVar2 = next_char();
    }
    if (uVar2 != 0x5d) goto LAB_001123cf;
    lVar9 = (long)_ZL11array_index_1 - (long)_ZL11array_index_0;
    if (lVar9 == 0) {
      pcVar8 = "empty index";
      goto LAB_00112381;
    }
    if (_ZL11array_index_1 != _ZL11array_index_2) {
LAB_001120f7:
      puVar4 = (undefined8 *)((long)_ZL11array_index_1 + 1);
      *(undefined1 *)_ZL11array_index_1 = 0;
      _ZL11array_index_1 = puVar4;
      iVar1 = next_char();
      if (iVar1 != 0x20) {
        pcVar8 = "space missing after index";
        goto LAB_00112381;
      }
      goto LAB_00112150;
    }
    puVar4 = _ZL11array_index_0;
    puVar5 = (undefined8 *)realloc(_ZL11array_index_0,lVar9 * 2);
    if (puVar5 != (undefined8 *)0x0) {
      _ZL11array_index_1 = (undefined8 *)(lVar9 + (long)puVar5);
      _ZL11array_index_2 = (undefined8 *)(lVar9 * 2 + (long)puVar5);
      _ZL11array_index_0 = puVar5;
      goto LAB_001120f7;
    }
  }
  parse_assignment();
LAB_001123eb:
  parse_assignment();
  if ((void *)*puVar4 == (void *)0x0) {
    return extraout_RAX_00;
  }
  operator_delete((void *)*puVar4);
  return extraout_RAX;
}

Assistant:

static int64_t
parse_assignment ()
{
  int32_t ch = next_char ();
  if (ch == EOF) parse_error ("unexpected end-of-file (without '.')");
  if (ch == '.')
  {
    while ((ch = next_char ()) == ' ')
      ;
    if (ch == EOF) parse_error ("end-of-file after '.' instead of new-line");
    if (ch != '\n')
    {
      if (isprint (ch))
        parse_error ("unexpected character '%c' after '.'", ch);
      else
        parse_error ("unexpected character code 0x%02x after '.'", ch);
    }
    msg (4, "read terminating '.'");
    found_end_of_witness = 1;
    return -1;
  }
  if (ch == '@' || ch == '#')
  {
    prev_char (ch);
    return -1;
  }
  prev_char (ch);
  int64_t res = parse_unsigned_number (&ch);
  if (ch != ' ') parse_error ("space missing after '%" PRId64 "'", res);
  ch = next_char ();
  BTOR2_RESET_STACK (array_index);
  if (ch == '[')
  {
    index_columno = columno + 1;
    while ((ch = next_char ()) == '0' || ch == '1')
      BTOR2_PUSH_STACK (array_index, ch);
    /* btormc trace compatibility: btormc --trace-gen-full represents
     * 'initialize all array elements' as <id> [*] <value> */
    if (ch == '*')
    {
      BTOR2_PUSH_STACK (array_index, ch);
      ch = next_char ();
    }
    if (ch != ']') parse_error ("expected ] after index");
    if (BTOR2_EMPTY_STACK (array_index)) parse_error ("empty index");
    BTOR2_PUSH_STACK (array_index, 0);
    ch = next_char ();
    if (ch != ' ') parse_error ("space missing after index");
  }
  else
  {
    prev_char (ch);
  }
  BTOR2_RESET_STACK (constant);
  constant_columno = columno + 1;
  while ((ch = next_char ()) == '0' || ch == '1')
    BTOR2_PUSH_STACK (constant, ch);
  if (BTOR2_EMPTY_STACK (constant))
    parse_error ("empty constant");
  else if (ch != ' ' && ch != '\n')
    parse_error ("expected space or new-line after assignment");
  BTOR2_PUSH_STACK (constant, 0);
  BTOR2_RESET_STACK (symbol);
  while (ch != '\n')
    if ((ch = next_char ()) == EOF)
      parse_error ("unexpected end-of-file in assignment");
    else if (ch != '\n')
      BTOR2_PUSH_STACK (symbol, ch);
  if (!BTOR2_EMPTY_STACK (symbol)) BTOR2_PUSH_STACK (symbol, 0);
  return res;
}